

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_huffman_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  int *piVar1;
  cram_codec *__ptr;
  void *__ptr_00;
  void *pvVar2;
  kh_m_i2i_t *pkVar3;
  void *__ptr_01;
  ulong uVar4;
  cram_huffman_code *__base;
  ulong uVar5;
  cram_huffman_code *pcVar6;
  code *pcVar7;
  int iVar8;
  int iVar9;
  code *pcVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  bool bVar21;
  
  __ptr = (cram_codec *)malloc(0x240);
  iVar9 = 0;
  if (__ptr == (cram_codec *)0x0) {
    return (cram_codec *)0x0;
  }
  __ptr->codec = E_HUFFMAN;
  pvVar2 = (void *)0x0;
  uVar11 = 0;
  __ptr_00 = (void *)0x0;
  for (lVar19 = 0; lVar19 != 0x400; lVar19 = lVar19 + 1) {
    if (st->freqs[lVar19] != 0) {
      if (iVar9 <= (int)uVar11) {
        bVar21 = iVar9 == 0;
        iVar9 = iVar9 * 2;
        if (bVar21) {
          iVar9 = 0x400;
        }
        __ptr_00 = realloc(__ptr_00,(long)iVar9 << 2);
        pvVar2 = realloc(pvVar2,(long)iVar9 << 2);
        if ((__ptr_00 == (void *)0x0) || (pvVar2 == (void *)0x0)) {
          free(__ptr_00);
          free(pvVar2);
          free(__ptr);
          return (cram_codec *)0x0;
        }
      }
      *(int *)((long)__ptr_00 + (long)(int)uVar11 * 4) = (int)lVar19;
      iVar13 = st->freqs[lVar19];
      *(int *)((long)pvVar2 + (long)(int)uVar11 * 4) = iVar13;
      if (iVar13 < 1) {
        __assert_fail("st->freqs[i] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                      ,0x4cb,
                      "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                     );
      }
      uVar11 = uVar11 + 1;
    }
  }
  pkVar3 = st->h;
  if (pkVar3 != (kh_m_i2i_t *)0x0) {
    bVar20 = 0;
    for (uVar18 = 0; uVar18 != pkVar3->n_buckets; uVar18 = uVar18 + 1) {
      if ((pkVar3->flags[uVar18 >> 4] >> (bVar20 & 0x1e) & 3) == 0) {
        if (iVar9 <= (int)uVar11) {
          bVar21 = iVar9 == 0;
          iVar9 = iVar9 * 2;
          if (bVar21) {
            iVar9 = 0x400;
          }
          __ptr_00 = realloc(__ptr_00,(long)iVar9 << 2);
          pvVar2 = realloc(pvVar2,(long)iVar9 << 2);
          if (__ptr_00 == (void *)0x0) {
            return (cram_codec *)0x0;
          }
          if (pvVar2 == (void *)0x0) {
            return (cram_codec *)0x0;
          }
          pkVar3 = st->h;
        }
        *(khint32_t *)((long)__ptr_00 + (long)(int)uVar11 * 4) = pkVar3->keys[uVar18];
        iVar13 = pkVar3->vals[uVar18];
        *(int *)((long)pvVar2 + (long)(int)uVar11 * 4) = iVar13;
        if (iVar13 < 1) {
          __assert_fail("freqs[nvals] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                        ,0x4e0,
                        "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                       );
        }
        uVar11 = uVar11 + 1;
      }
      bVar20 = bVar20 + 2;
    }
  }
  if ((int)uVar11 < 1) {
    __assert_fail("nvals > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                  ,0x4e8,
                  "cram_codec *cram_huffman_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                 );
  }
  pvVar2 = realloc(pvVar2,(ulong)(uVar11 * 2) * 4);
  __ptr_01 = calloc((ulong)(uVar11 * 2),4);
  if (pvVar2 == (void *)0x0) {
    return (cram_codec *)0x0;
  }
  if (__ptr_01 == (void *)0x0) {
    return (cram_codec *)0x0;
  }
  uVar12 = (ulong)uVar11;
  do {
    uVar4 = 0;
    uVar11 = (uint)uVar12;
    uVar5 = 0;
    if (0 < (int)uVar11) {
      uVar5 = uVar12 & 0xffffffff;
    }
    uVar16 = 0;
    uVar14 = 0;
    iVar9 = 0x7fffffff;
    iVar13 = 0x7fffffff;
    while( true ) {
      uVar18 = (uint)uVar14;
      if (uVar5 == uVar4) break;
      iVar17 = *(int *)((long)pvVar2 + uVar4 * 4);
      iVar8 = iVar13;
      if (iVar17 < 0) {
LAB_001389ba:
        uVar14 = (ulong)uVar18;
        iVar17 = iVar9;
      }
      else {
        if (iVar9 <= iVar17) {
          iVar8 = iVar17;
          if (iVar13 < iVar17) {
            iVar8 = iVar13;
          }
          if (iVar17 < iVar13) {
            uVar18 = (uint)uVar4;
          }
          goto LAB_001389ba;
        }
        uVar14 = uVar16;
        uVar16 = uVar4 & 0xffffffff;
        iVar8 = iVar9;
      }
      uVar4 = uVar4 + 1;
      iVar9 = iVar17;
      iVar13 = iVar8;
    }
    if (iVar13 == 0x7fffffff) {
      uVar4 = (ulong)(uVar11 >> 1);
      for (uVar12 = 0; uVar12 <= uVar4; uVar12 = uVar12 + 1) {
        iVar9 = 0;
        piVar1 = (int *)((long)__ptr_01 + uVar12 * 4);
        for (piVar15 = piVar1; (long)*piVar15 != 0;
            piVar15 = (int *)((long)__ptr_01 + (long)*piVar15 * 4)) {
          iVar9 = iVar9 + 1;
        }
        *piVar1 = iVar9;
        piVar1 = (int *)((long)pvVar2 + uVar12 * 4);
        *piVar1 = -*piVar1;
      }
      __base = (cram_huffman_code *)malloc((uVar4 + 1) * 0x10);
      if (__base == (cram_huffman_code *)0x0) {
        return (cram_codec *)0x0;
      }
      pcVar6 = __base;
      for (uVar12 = 0; uVar12 <= uVar4; uVar12 = uVar12 + 1) {
        pcVar6->symbol = *(int32_t *)((long)__ptr_00 + uVar12 * 4);
        pcVar6->len = *(int32_t *)((long)__ptr_01 + uVar12 * 4);
        pcVar6 = pcVar6 + 1;
      }
      qsort(__base,uVar4 + 1,0x10,code_sort);
      iVar9 = 0;
      iVar13 = __base->len;
      for (uVar12 = 0; uVar12 <= uVar4; uVar12 = uVar12 + 1) {
        iVar17 = __base[uVar12].len;
        for (; iVar17 != iVar13; iVar13 = iVar13 + 1) {
          iVar9 = iVar9 * 2;
        }
        __base[uVar12].code = iVar9;
        uVar18 = __base[uVar12].symbol + 1;
        if (uVar18 < 0x81) {
          *(int *)((long)&__ptr->field_6 + (ulong)uVar18 * 4 + 0xc) = (int)uVar12;
        }
        iVar9 = iVar9 + 1;
        iVar13 = iVar17;
      }
      free(__ptr_01);
      free(__ptr_00);
      free(pvVar2);
      (__ptr->field_6).e_huffman.codes = __base;
      (__ptr->field_6).e_huffman.nvals = (uVar11 >> 1) + 1;
      bVar21 = __base->len == 0;
      pcVar7 = cram_huffman_encode_char;
      if (bVar21) {
        pcVar7 = cram_huffman_encode_char0;
      }
      pcVar10 = cram_huffman_encode_int;
      if (bVar21) {
        pcVar10 = cram_huffman_encode_int0;
      }
      __ptr->free = cram_huffman_encode_free;
      if (option - E_BYTE < 2) {
        pcVar10 = pcVar7;
      }
      __ptr->encode = pcVar10;
      __ptr->store = cram_huffman_encode_store;
      return __ptr;
    }
    *(int *)((long)pvVar2 + uVar12 * 4) = iVar13 + iVar9;
    *(uint *)((long)__ptr_01 + (long)(int)uVar16 * 4) = uVar11;
    *(uint *)((long)__ptr_01 + (long)(int)uVar18 * 4) = uVar11;
    piVar1 = (int *)((long)pvVar2 + (long)(int)uVar16 * 4);
    *piVar1 = -*piVar1;
    piVar1 = (int *)((long)pvVar2 + (long)(int)uVar18 * 4);
    *piVar1 = -*piVar1;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

cram_codec *cram_huffman_encode_init(cram_stats *st,
				     enum cram_external_type option,
				     void *dat,
				     int version) {
    int *vals = NULL, *freqs = NULL, vals_alloc = 0, *lens, code, len;
    int nvals, i, ntot = 0, max_val = 0, min_val = INT_MAX, k;
    cram_codec *c;
    cram_huffman_code *codes;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_HUFFMAN;

    /* Count number of unique symbols */
    for (nvals = i = 0; i < MAX_STAT_VAL; i++) {
	if (!st->freqs[i])
	    continue;
	if (nvals >= vals_alloc) {
	    vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
	    vals  = realloc(vals,  vals_alloc * sizeof(int));
	    freqs = realloc(freqs, vals_alloc * sizeof(int));
	    if (!vals || !freqs) {
		if (vals)  free(vals);
		if (freqs) free(freqs);
		free(c);
		return NULL;
	    }
	}
	vals[nvals] = i;
	freqs[nvals] = st->freqs[i];
	assert(st->freqs[i] > 0);
	ntot += freqs[nvals];
	if (max_val < i) max_val = i;
	if (min_val > i) min_val = i;
	nvals++;
    }
    if (st->h) {
	khint_t k;

	for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
	    if (!kh_exist(st->h, k))
		continue;
	    if (nvals >= vals_alloc) {
		vals_alloc = vals_alloc ? vals_alloc*2 : 1024;
		vals  = realloc(vals,  vals_alloc * sizeof(int));
		freqs = realloc(freqs, vals_alloc * sizeof(int));
		if (!vals || !freqs)
		    return NULL;
	    }
	    vals[nvals]= kh_key(st->h, k);
	    freqs[nvals] = kh_val(st->h, k);
	    assert(freqs[nvals] > 0);
	    ntot += freqs[nvals];
	    if (max_val < i) max_val = i;
	    if (min_val > i) min_val = i;
	    nvals++;
	}
    }

    assert(nvals > 0);

    freqs = realloc(freqs, 2*nvals*sizeof(*freqs));
    lens = calloc(2*nvals, sizeof(*lens));
    if (!lens || !freqs)
	return NULL;

    /* Inefficient, use pointers to form chain so we can insert and maintain
     * a sorted list? This is currently O(nvals^2) complexity.
     */
    for (;;) {
	int low1 = INT_MAX, low2 = INT_MAX;
	int ind1 = 0, ind2 = 0;
	for (i = 0; i < nvals; i++) {
	    if (freqs[i] < 0)
		continue;
	    if (low1 > freqs[i]) 
		low2 = low1, ind2 = ind1, low1 = freqs[i], ind1 = i;
	    else if (low2 > freqs[i])
		low2 = freqs[i], ind2 = i;
	}
	if (low2 == INT_MAX)
	    break;

	freqs[nvals] = low1 + low2;
	lens[ind1] = nvals;
	lens[ind2] = nvals;
	freqs[ind1] *= -1;
	freqs[ind2] *= -1;
	nvals++;
    }
    nvals = nvals/2+1;

    /* Assign lengths */
    for (i = 0; i < nvals; i++) {
	int code_len = 0;
	for (k = lens[i]; k; k = lens[k])
	    code_len++;
	lens[i] = code_len;
	freqs[i] *= -1;
	//fprintf(stderr, "%d / %d => %d\n", vals[i], freqs[i], lens[i]);
    }


    /* Sort, need in a struct */
    if (!(codes = malloc(nvals * sizeof(*codes))))
	return NULL;
    for (i = 0; i < nvals; i++) {
	codes[i].symbol = vals[i];
	codes[i].len = lens[i];
    }
    qsort(codes, nvals, sizeof(*codes), code_sort);

    /*
     * Generate canonical codes from lengths.
     * Sort by length.
     * Start with 0.
     * Every new code of same length is +1.
     * Every new code of new length is +1 then <<1 per extra length.
     *
     * /\
     * a/\
     * /\/\
     * bcd/\
     *    ef
     * 
     * a 1  0
     * b 3  4 (0+1)<<2
     * c 3  5
     * d 3  6
     * e 4  14  (6+1)<<1
     * f 5  15     
     */
    code = 0; len = codes[0].len;
    for (i = 0; i < nvals; i++) {
	while (len != codes[i].len) {
	    code<<=1;
	    len++;
	}
	codes[i].code = code++;

	if (codes[i].symbol >= -1 && codes[i].symbol < MAX_HUFF)
	    c->e_huffman.val2code[codes[i].symbol+1] = i;

	//fprintf(stderr, "sym %d, code %d, len %d\n",
	//	codes[i].symbol, codes[i].code, codes[i].len);
    }

    free(lens);
    free(vals);
    free(freqs);

    c->e_huffman.codes = codes;
    c->e_huffman.nvals = nvals;

    c->free = cram_huffman_encode_free;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_char0;
	else
	    c->encode = cram_huffman_encode_char;
    } else {
	if (c->e_huffman.codes[0].len == 0)
	    c->encode = cram_huffman_encode_int0;
	else
	    c->encode = cram_huffman_encode_int;
    }
    c->store = cram_huffman_encode_store;

    return c;
}